

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  lu_byte *plVar1;
  byte bVar2;
  FuncState *fs;
  int n;
  int n_00;
  
  fs = ls->fs;
  n = nvars - nexps;
  if (e->k - VCALL < 2) {
    n_00 = -1;
    if (-1 < n) {
      n_00 = n;
    }
    luaK_setreturns(fs,e,n_00 + 1);
    if (0 < n) {
      luaK_reserveregs(fs,n_00);
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg(fs,e);
    }
    if (0 < n) {
      bVar2 = fs->freereg;
      luaK_reserveregs(fs,n);
      luaK_nil(fs,(uint)bVar2,n);
    }
  }
  if (nvars < nexps) {
    plVar1 = &ls->fs->freereg;
    *plVar1 = *plVar1 + (char)n;
  }
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int extra = nvars - nexps;
  if (hasmultret(e->k)) {
    extra++;  /* includes call itself */
    if (extra < 0) extra = 0;
    /* following adjusts the C operand in the OP_CALL instruction */
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
    if (extra > 1) luaK_reserveregs(fs, extra-1);
  }
  else {
    if (e->k != VVOID) luaK_exp2nextreg(fs, e);  /* close last expression */
    if (extra > 0) {
      int reg = fs->freereg;
      luaK_reserveregs(fs, extra);
      /* RAVI TODO for typed variables we should not set to nil? */
      luaK_nil(fs, reg, extra);
    }
  }
  if (nexps > nvars)
    ls->fs->freereg -= nexps - nvars;  /* remove extra values */
}